

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

void gdImageBrushApply(gdImagePtr im,int x,int y)

{
  int iVar1;
  gdImageStruct *pgVar2;
  gdImagePtr pgVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int y_00;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  pgVar2 = im->brush;
  if (pgVar2 != (gdImageStruct *)0x0) {
    iVar1 = pgVar2->sx;
    iVar9 = pgVar2->sy;
    y_00 = y - iVar9 / 2;
    iVar7 = y_00 + iVar9;
    iVar10 = x - iVar1 / 2;
    iVar8 = iVar10 + iVar1;
    if (im->trueColor == 0) {
      if (0 < iVar9) {
        iVar9 = 0;
        do {
          if (0 < iVar1) {
            iVar6 = 0;
            do {
              pgVar3 = im->brush;
              uVar5 = gdImageGetPixel(pgVar3,iVar6,iVar9);
              if (uVar5 != pgVar3->transparent) {
                if (pgVar3->trueColor == 0) {
                  iVar4 = im->brushColorMap[(int)uVar5];
                }
                else {
                  iVar4 = gdImageColorResolveAlpha
                                    (im,uVar5 >> 0x10 & 0xff,uVar5 >> 8 & 0xff,uVar5 & 0xff,
                                     uVar5 >> 0x18 & 0x7f);
                }
                gdImageSetPixel(im,iVar10 + iVar6,y_00,iVar4);
              }
              iVar4 = iVar10 + iVar6;
              iVar6 = iVar6 + 1;
            } while (iVar4 + 1 < iVar8);
          }
          iVar9 = iVar9 + 1;
          y_00 = y_00 + 1;
        } while (y_00 < iVar7);
      }
    }
    else if (pgVar2->trueColor == 0) {
      if (0 < iVar9) {
        iVar9 = 0;
        do {
          if (0 < iVar1) {
            iVar6 = 0;
            do {
              pgVar3 = im->brush;
              iVar4 = gdImageGetPixel(pgVar3,iVar6,iVar9);
              if (iVar4 != pgVar3->transparent) {
                iVar4 = gdImageGetTrueColorPixel(pgVar3,iVar6,iVar9);
                gdImageSetPixel(im,iVar10 + iVar6,y_00,iVar4);
              }
              iVar4 = iVar10 + iVar6;
              iVar6 = iVar6 + 1;
            } while (iVar4 + 1 < iVar8);
          }
          iVar9 = iVar9 + 1;
          y_00 = y_00 + 1;
        } while (y_00 < iVar7);
      }
    }
    else if (0 < iVar9) {
      iVar9 = 0;
      do {
        if (0 < iVar1) {
          iVar6 = 0;
          do {
            pgVar3 = im->brush;
            iVar4 = gdImageGetTrueColorPixel(pgVar3,iVar6,iVar9);
            if (iVar4 != pgVar3->transparent) {
              gdImageSetPixel(im,iVar10 + iVar6,y_00,iVar4);
            }
            iVar4 = iVar10 + iVar6;
            iVar6 = iVar6 + 1;
          } while (iVar4 + 1 < iVar8);
        }
        iVar9 = iVar9 + 1;
        y_00 = y_00 + 1;
      } while (y_00 < iVar7);
    }
  }
  return;
}

Assistant:

static void
gdImageBrushApply (gdImagePtr im, int x, int y)
{
	int lx, ly;
	int hy;
	int hx;
	int x1, y1, x2, y2;
	int srcx, srcy;
	if (!im->brush) {
		return;
	}
	hy = gdImageSY (im->brush) / 2;
	y1 = y - hy;
	y2 = y1 + gdImageSY (im->brush);
	hx = gdImageSX (im->brush) / 2;
	x1 = x - hx;
	x2 = x1 + gdImageSX (im->brush);
	srcy = 0;
	if (im->trueColor) {
		if (im->brush->trueColor) {
			for (ly = y1; (ly < y2); ly++) {
				srcx = 0;
				for (lx = x1; (lx < x2); lx++) {
					int p;
					p = gdImageGetTrueColorPixel (im->brush, srcx, srcy);
					/* 2.0.9, Thomas Winzig: apply simple full transparency */
					if (p != gdImageGetTransparent (im->brush)) {
						gdImageSetPixel (im, lx, ly, p);
					}
					srcx++;
				}
				srcy++;
			}
		} else {
			/* 2.0.12: Brush palette, image truecolor (thanks to Thorben Kundinger
			   for pointing out the issue) */
			for (ly = y1; (ly < y2); ly++) {
				srcx = 0;
				for (lx = x1; (lx < x2); lx++) {
					int p, tc;
					p = gdImageGetPixel (im->brush, srcx, srcy);
					tc = gdImageGetTrueColorPixel (im->brush, srcx, srcy);
					/* 2.0.9, Thomas Winzig: apply simple full transparency */
					if (p != gdImageGetTransparent (im->brush)) {
						gdImageSetPixel (im, lx, ly, tc);
					}
					srcx++;
				}
				srcy++;
			}
		}
	} else {
		for (ly = y1; (ly < y2); ly++) {
			srcx = 0;
			for (lx = x1; (lx < x2); lx++) {
				int p;
				p = gdImageGetPixel (im->brush, srcx, srcy);
				/* Allow for non-square brushes! */
				if (p != gdImageGetTransparent (im->brush)) {
					/* Truecolor brush. Very slow
					   on a palette destination. */
					if (im->brush->trueColor) {
						gdImageSetPixel (im, lx, ly,
						                 gdImageColorResolveAlpha (im,
						                         gdTrueColorGetRed
						                         (p),
						                         gdTrueColorGetGreen
						                         (p),
						                         gdTrueColorGetBlue
						                         (p),
						                         gdTrueColorGetAlpha
						                         (p)));
					} else {
						gdImageSetPixel (im, lx, ly, im->brushColorMap[p]);
					}
				}
				srcx++;
			}
			srcy++;
		}
	}
}